

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

void dictRelease(dict *ht)

{
  dictEntry *pdVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  dictEntry *__ptr;
  ulong uVar3;
  
  if (ht->size != 0) {
    uVar3 = 0;
    do {
      if (ht->used == 0) break;
      __ptr = ht->table[uVar3];
      while (__ptr != (dictEntry *)0x0) {
        pdVar1 = __ptr->next;
        p_Var2 = ht->type->keyDestructor;
        if (p_Var2 != (_func_void_void_ptr_void_ptr *)0x0) {
          (*p_Var2)(ht->privdata,__ptr->key);
        }
        p_Var2 = ht->type->valDestructor;
        if (p_Var2 != (_func_void_void_ptr_void_ptr *)0x0) {
          (*p_Var2)(ht->privdata,__ptr->val);
        }
        free(__ptr);
        ht->used = ht->used - 1;
        __ptr = pdVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < ht->size);
  }
  free(ht->table);
  ht->table = (dictEntry **)0x0;
  ht->used = 0;
  ht->size = 0;
  ht->sizemask = 0;
  free(ht);
  return;
}

Assistant:

static void dictRelease(dict *ht) {
    _dictClear(ht);
    free(ht);
}